

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

bool __thiscall BackwardPass::ProcessNoImplicitCallUses(BackwardPass *this,Instr *instr)

{
  undefined1 *puVar1;
  OpCode OVar2;
  uint uVar3;
  BackwardPass *this_00;
  code *pcVar4;
  Opnd *pOVar5;
  bool bVar6;
  OpndKind OVar7;
  BOOLEAN BVar8;
  undefined4 *puVar9;
  Func *pFVar10;
  Func *pFVar11;
  JitArenaAllocator *stackSym;
  Instr *this_01;
  BackwardPass *pBVar12;
  long lVar13;
  Opnd *srcs [2];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  this_01 = instr;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    this_01 = (Instr *)0x1134;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1134,"(instr)","instr");
    if (!bVar6) goto LAB_003e22a5;
    *puVar9 = 0;
  }
  OVar2 = instr->m_opcode;
  if (OVar2 == NoImplicitCallUses) {
    if (this->tag != DeadStorePhase) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      this_01 = (Instr *)0x113a;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113a,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
      if (!bVar6) goto LAB_003e22a5;
      *puVar9 = 0;
    }
    if (instr->m_dst != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      this_01 = (Instr *)0x113b;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113b,"(!instr->GetDst())","!instr->GetDst()");
      if (!bVar6) goto LAB_003e22a5;
      *puVar9 = 0;
    }
    if (instr->m_src1 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      this_01 = (Instr *)0x113c;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113c,"(instr->GetSrc1())","instr->GetSrc1()");
      if (!bVar6) goto LAB_003e22a5;
      *puVar9 = 0;
    }
    OVar7 = IR::Opnd::GetKind(instr->m_src1);
    if ((OVar7 != OpndKindReg) && (OVar7 = IR::Opnd::GetKind(instr->m_src1), OVar7 != OpndKindSym))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      this_01 = (Instr *)0x113d;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113d,"(instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd())",
                         "instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd()");
      if (!bVar6) goto LAB_003e22a5;
      *puVar9 = 0;
    }
    if (((instr->m_src2 != (Opnd *)0x0) &&
        (OVar7 = IR::Opnd::GetKind(instr->m_src2), OVar7 != OpndKindReg)) &&
       (OVar7 = IR::Opnd::GetKind(instr->m_src2), OVar7 != OpndKindSym)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      this_01 = (Instr *)0x113e;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x113e,
                         "(!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd())"
                         ,
                         "!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd()"
                        );
      if (!bVar6) {
LAB_003e22a5:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    if (this->isCollectionPass == false) {
      srcs[0] = instr->m_src2;
      srcs[1] = (Opnd *)__tls_get_addr(&PTR_0155fe48);
      lVar13 = 0;
      do {
        pOVar5 = srcs[1];
        this_00 = (BackwardPass *)srcs[lVar13 + -1];
        if (this_00 == (BackwardPass *)0x0) break;
        pBVar12 = this_00;
        OVar7 = IR::Opnd::GetKind((Opnd *)this_00);
        if (OVar7 == OpndKindSym) {
          OVar7 = IR::Opnd::GetKind((Opnd *)this_00);
          if (OVar7 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pOVar5->_vptr_Opnd = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar6) goto LAB_003e22a5;
            *(undefined4 *)&pOVar5->_vptr_Opnd = 0;
          }
          stackSym = this_00->tempAlloc;
          if (*(SymKind *)
               ((long)&(stackSym->super_ArenaAllocator).
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                       super_ArenaData.bigBlocks + 4) == SymKindProperty) {
LAB_003e2150:
            pBVar12 = (BackwardPass *)0x0;
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pOVar5->_vptr_Opnd = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x115e,"(sym->IsPropertySym())","sym->IsPropertySym()");
            if (!bVar6) goto LAB_003e22a5;
            pBVar12 = (BackwardPass *)0x0;
LAB_003e21da:
            *(undefined4 *)&srcs[1]->_vptr_Opnd = 0;
          }
        }
        else {
          if (OVar7 != OpndKindReg) {
            ProcessNoImplicitCallUses();
            if (pBVar12->tag != DeadStorePhase) {
              return false;
            }
            if (pBVar12->currentPrePassLoop != (Loop *)0x0) {
              return false;
            }
            if ((((this_01->field_0x38 & 0x10) == 0) &&
                (bVar6 = OpCodeAttr::CallInstr(this_01->m_opcode), !bVar6)) &&
               ((bVar6 = IR::Instr::CallsAccessor(this_01,(PropertySymOpnd *)0x0), !bVar6 &&
                ((bVar6 = GlobOpt::MayNeedBailOnImplicitCall(this_01,(Value *)0x0,(Value *)0x0),
                 !bVar6 && (bVar6 = IR::Instr::HasAnyLoadHeapArgsOpCode(this_01), !bVar6)))))) {
              if (this_01->m_opcode == InlineeStart) {
                if (this_01->m_src1 != (Opnd *)0x0) {
                  bVar6 = ProcessInlineeStart(pBVar12,this_01);
                  return bVar6;
                }
                if ((this_01->m_func->field_0x240 & 2) != 0) {
                  return false;
                }
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar9 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x1fec,"(instr->m_func->m_hasInlineArgsOpt)",
                                   "instr->m_func->m_hasInlineArgsOpt");
                if (bVar6) {
                  *puVar9 = 0;
                  return false;
                }
                goto LAB_003e243f;
              }
              if (this_01->m_opcode != LdFuncExpr) {
                return false;
              }
            }
            if (this_01->m_opcode == InlineeStart) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar9 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1fe3,"(instr->m_opcode != Js::OpCode::InlineeStart)",
                                 "instr->m_opcode != Js::OpCode::InlineeStart");
              if (!bVar6) {
LAB_003e243f:
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *puVar9 = 0;
            }
            pFVar10 = this_01->m_func;
            puVar1 = &pFVar10->field_0x240;
            *(uint *)puVar1 = *(uint *)puVar1 | 0x8000;
            pFVar10 = pFVar10->parentFunc;
            if (pFVar10 != (Func *)0x0) {
              for (pFVar11 = pFVar10->parentFunc; pFVar11 != (Func *)0x0;
                  pFVar11 = pFVar11->parentFunc) {
                pFVar10->field_0x241 = pFVar10->field_0x241 | 0x80;
                pFVar10 = pFVar11;
              }
            }
            return false;
          }
          OVar7 = IR::Opnd::GetKind((Opnd *)this_00);
          if (OVar7 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pOVar5->_vptr_Opnd = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar6) goto LAB_003e22a5;
            *(undefined4 *)&pOVar5->_vptr_Opnd = 0;
          }
          stackSym = this_00->tempAlloc;
          BVar8 = BVSparse<Memory::JitArenaAllocator>::TestAndClear
                            (this->considerSymsAsRealUsesInNoImplicitCallUses,
                             *(BVIndex *)
                              &(stackSym->super_ArenaAllocator).
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               .super_ArenaData.bigBlocks);
          if (BVar8 != '\0') {
            if (*(SymKind *)
                 ((long)&(stackSym->super_ArenaAllocator).
                         super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                         super_ArenaData.bigBlocks + 4) != SymKindStack) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *(undefined4 *)&pOVar5->_vptr_Opnd = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                 ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
              if (!bVar6) goto LAB_003e22a5;
              *(undefined4 *)&pOVar5->_vptr_Opnd = 0;
            }
            ProcessStackSymUse(this,(StackSym *)stackSym,'\x01');
          }
          bVar6 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)this_00);
          if (!bVar6) goto LAB_003e2150;
          bVar6 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)this_00);
          pBVar12 = this_00;
          if (!bVar6) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pOVar5->_vptr_Opnd = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x24d,"(IsArrayRegOpnd())","IsArrayRegOpnd()");
            if (bVar6) goto LAB_003e21da;
            goto LAB_003e22a5;
          }
        }
        uVar3 = *(uint *)&(stackSym->super_ArenaAllocator).
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                          super_ArenaData.bigBlocks;
        this_01 = (Instr *)(ulong)uVar3;
        BVSparse<Memory::JitArenaAllocator>::Set(this->currentBlock->noImplicitCallUses,uVar3);
        local_32[0] = ((ValueType *)&this_00->globOpt)->field_0;
        bVar6 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_32[0].field_0);
        if (bVar6) {
          bVar6 = ValueType::HasNoMissingValues((ValueType *)&local_32[0].field_0);
          if (bVar6) {
            uVar3 = *(uint *)&(stackSym->super_ArenaAllocator).
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                              .super_ArenaData.bigBlocks;
            this_01 = (Instr *)(ulong)uVar3;
            BVSparse<Memory::JitArenaAllocator>::Set
                      (this->currentBlock->noImplicitCallNoMissingValuesUses,uVar3);
          }
          bVar6 = ValueType::HasVarElements((ValueType *)&local_32[0].field_0);
          if (!bVar6) {
            uVar3 = *(uint *)&(stackSym->super_ArenaAllocator).
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                              .super_ArenaData.bigBlocks;
            this_01 = (Instr *)(ulong)uVar3;
            BVSparse<Memory::JitArenaAllocator>::Set
                      (this->currentBlock->noImplicitCallNativeArrayUses,uVar3);
          }
          if (pBVar12 != (BackwardPass *)0x0) {
            this_01 = instr;
            ProcessArrayRegOpndUse(this,instr,(ArrayRegOpnd *)pBVar12);
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 == 1);
      if (this->currentPrePassLoop == (Loop *)0x0) {
        BasicBlock::RemoveInstr(this->currentBlock,instr);
      }
    }
  }
  return OVar2 == NoImplicitCallUses;
}

Assistant:

bool
BackwardPass::ProcessNoImplicitCallUses(IR::Instr *const instr)
{
    Assert(instr);

    if(instr->m_opcode != Js::OpCode::NoImplicitCallUses)
    {
        return false;
    }
    Assert(tag == Js::DeadStorePhase);
    Assert(!instr->GetDst());
    Assert(instr->GetSrc1());
    Assert(instr->GetSrc1()->IsRegOpnd() || instr->GetSrc1()->IsSymOpnd());
    Assert(!instr->GetSrc2() || instr->GetSrc2()->IsRegOpnd() || instr->GetSrc2()->IsSymOpnd());

    if(IsCollectionPass())
    {
        return true;
    }

    IR::Opnd *const srcs[] = { instr->GetSrc1(), instr->GetSrc2() };
    for(int i = 0; i < sizeof(srcs) / sizeof(srcs[0]) && srcs[i]; ++i)
    {
        IR::Opnd *const src = srcs[i];
        IR::ArrayRegOpnd *arraySrc = nullptr;
        Sym *sym = nullptr;
        switch(src->GetKind())
        {
            case IR::OpndKindReg:
            {
                IR::RegOpnd *const regSrc = src->AsRegOpnd();
                sym = regSrc->m_sym;
                if(considerSymsAsRealUsesInNoImplicitCallUses->TestAndClear(sym->m_id))
                {
                    ProcessStackSymUse(sym->AsStackSym(), true);
                }
                if(regSrc->IsArrayRegOpnd())
                {
                    arraySrc = regSrc->AsArrayRegOpnd();
                }
                break;
            }

            case IR::OpndKindSym:
                sym = src->AsSymOpnd()->m_sym;
                Assert(sym->IsPropertySym());
                break;

            default:
                Assert(false);
                __assume(false);
        }

        currentBlock->noImplicitCallUses->Set(sym->m_id);
        const ValueType valueType(src->GetValueType());
        if(valueType.IsArrayOrObjectWithArray())
        {
            if(valueType.HasNoMissingValues())
            {
                currentBlock->noImplicitCallNoMissingValuesUses->Set(sym->m_id);
            }
            if(!valueType.HasVarElements())
            {
                currentBlock->noImplicitCallNativeArrayUses->Set(sym->m_id);
            }
            if(arraySrc)
            {
                ProcessArrayRegOpndUse(instr, arraySrc);
            }
        }
    }

    if(!IsPrePass())
    {
        currentBlock->RemoveInstr(instr);
    }
    return true;
}